

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alignment.h
# Opt level: O2

void __thiscall llvm::Align::Align(Align *this,uint64_t Value)

{
  long lVar1;
  uint __line;
  char *__assertion;
  
  this->ShiftValue = '\0';
  if (Value == 0) {
    __assertion = "Value > 0 && \"Value must not be 0\"";
    __line = 0x4e;
  }
  else {
    if ((Value & Value - 1) == 0) {
      lVar1 = 0x3f;
      if (Value != 0) {
        for (; Value >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      this->ShiftValue = (uint8_t)lVar1;
      return;
    }
    __assertion = "llvm::isPowerOf2_64(Value) && \"Alignment is not a power of 2\"";
    __line = 0x4f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                ,__line,"llvm::Align::Align(uint64_t)");
}

Assistant:

explicit Align(uint64_t Value) {
    assert(Value > 0 && "Value must not be 0");
    assert(llvm::isPowerOf2_64(Value) && "Alignment is not a power of 2");
    ShiftValue = Log2_64(Value);
    assert(ShiftValue < 64 && "Broken invariant");
  }